

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall libcellml::Parser::~Parser(Parser *this)

{
  ParserImpl *this_00;
  Parser *this_local;
  
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Parser_0046a160;
  (this->super_Strict)._vptr_Strict = (_func_int **)&DAT_0046a180;
  this_00 = pFunc(this);
  if (this_00 != (ParserImpl *)0x0) {
    ParserImpl::~ParserImpl(this_00);
    operator_delete(this_00,0x70);
  }
  Strict::~Strict(&this->super_Strict);
  Logger::~Logger(&this->super_Logger);
  return;
}

Assistant:

Parser::~Parser()
{
    delete pFunc();
}